

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

uint32 __thiscall rw::Atomic::streamGetSize(Atomic *this)

{
  int iVar1;
  uint32 uVar2;
  
  iVar1 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  if (version < 0x30400) {
    uVar2 = Geometry::streamGetSize(this->geometry);
    uVar2 = iVar1 + uVar2 + 0x30;
  }
  else {
    uVar2 = iVar1 + 0x28;
  }
  return uVar2;
}

Assistant:

uint32
Atomic::streamGetSize(void)
{
	uint32 size = 12 + 12 + 12 + s_plglist.streamGetSize(this);
	if(rw::version < 0x30400)
		size += 12 + this->geometry->streamGetSize();
	else
		size += 4;
	return size;
}